

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void * Map_Check(Map *tree,void *str,size_t size)

{
  ulong uVar1;
  Map *pMVar2;
  
  uVar1 = 0;
  if (size == 0) {
LAB_00143822:
    pMVar2 = tree;
    if (uVar1 < size) {
      return (void *)0x0;
    }
  }
  else {
    do {
      pMVar2 = tree->delta[*(byte *)((long)str + uVar1)];
      if (pMVar2 == (Map *)0x0) goto LAB_00143822;
      uVar1 = uVar1 + 1;
      tree = pMVar2;
    } while (size != uVar1);
  }
  return pMVar2->ID;
}

Assistant:

void* Map_Check(Map *tree, void *str,size_t size)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);

	if(temp<size)
	{
		return NULL;	
	}else
	{
		return tree->ID; //this has been set to be the last reached node
	}
}